

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O3

void png_colorspace_set_rgb_coefficients(png_structrp png_ptr)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  char *error_message;
  uint uVar7;
  uint uVar8;
  double dVar9;
  double dVar10;
  
  if (png_ptr->rgb_to_gray_coefficients_set != '\0') {
    return;
  }
  if (((png_ptr->colorspace).flags & 2) == 0) {
    return;
  }
  iVar5 = (png_ptr->colorspace).end_points_XYZ.red_Y;
  if (-1 < iVar5) {
    iVar1 = (png_ptr->colorspace).end_points_XYZ.green_Y;
    iVar2 = (png_ptr->colorspace).end_points_XYZ.blue_Y;
    iVar4 = iVar1 + iVar5 + iVar2;
    if (0 < iVar4) {
      dVar10 = (double)iVar4;
      if (iVar5 == 0) {
        uVar7 = 0;
      }
      else {
        dVar9 = floor(((double)iVar5 * 32768.0) / dVar10 + 0.5);
        if ((2147483647.0 < dVar9) || (dVar9 < -2147483648.0)) goto LAB_002bc9c4;
        uVar7 = (uint)dVar9;
      }
      if ((-1 < iVar1) && (uVar7 < 0x8001)) {
        if (iVar1 == 0) {
          uVar8 = 0;
        }
        else {
          dVar9 = floor(((double)iVar1 * 32768.0) / dVar10 + 0.5);
          if ((2147483647.0 < dVar9) || (dVar9 < -2147483648.0)) goto LAB_002bc9c4;
          uVar8 = (uint)dVar9;
        }
        if ((-1 < iVar2) && (uVar8 < 0x8001)) {
          if (iVar2 == 0) {
            uVar3 = 0;
          }
          else {
            dVar10 = floor(((double)iVar2 * 32768.0) / dVar10 + 0.5);
            if (((2147483647.0 < dVar10) || (dVar10 < -2147483648.0)) ||
               (uVar3 = (uint)dVar10, 0x8000 < uVar3)) goto LAB_002bc9c4;
          }
          uVar6 = uVar8 + uVar7 + uVar3;
          if (uVar6 < 0x8002) {
            iVar5 = -1;
            if ((uVar6 == 0x8001) || (iVar5 = 1, uVar6 < 0x8000)) {
              if ((uVar8 < uVar7) || (uVar8 < uVar3)) {
                if ((uVar7 < uVar8) || (uVar7 < uVar3)) {
                  uVar3 = uVar3 + iVar5;
                }
                else {
                  uVar7 = iVar5 + uVar7;
                }
              }
              else {
                uVar8 = iVar5 + uVar8;
              }
            }
            if (uVar3 + uVar8 + uVar7 == 0x8000) {
              png_ptr->rgb_to_gray_red_coeff = (png_uint_16)uVar7;
              png_ptr->rgb_to_gray_green_coeff = (png_uint_16)uVar8;
              return;
            }
            error_message = "internal error handling cHRM coefficients";
            goto LAB_002bc9cb;
          }
        }
      }
    }
  }
LAB_002bc9c4:
  error_message = "internal error handling cHRM->XYZ";
LAB_002bc9cb:
  png_error(png_ptr,error_message);
}

Assistant:

void /* PRIVATE */
png_colorspace_set_rgb_coefficients(png_structrp png_ptr)
{
   /* Set the rgb_to_gray coefficients from the colorspace. */
   if (png_ptr->rgb_to_gray_coefficients_set == 0 &&
      (png_ptr->colorspace.flags & PNG_COLORSPACE_HAVE_ENDPOINTS) != 0)
   {
      /* png_set_background has not been called, get the coefficients from the Y
       * values of the colorspace colorants.
       */
      png_fixed_point r = png_ptr->colorspace.end_points_XYZ.red_Y;
      png_fixed_point g = png_ptr->colorspace.end_points_XYZ.green_Y;
      png_fixed_point b = png_ptr->colorspace.end_points_XYZ.blue_Y;
      png_fixed_point total = r+g+b;

      if (total > 0 &&
         r >= 0 && png_muldiv(&r, r, 32768, total) && r >= 0 && r <= 32768 &&
         g >= 0 && png_muldiv(&g, g, 32768, total) && g >= 0 && g <= 32768 &&
         b >= 0 && png_muldiv(&b, b, 32768, total) && b >= 0 && b <= 32768 &&
         r+g+b <= 32769)
      {
         /* We allow 0 coefficients here.  r+g+b may be 32769 if two or
          * all of the coefficients were rounded up.  Handle this by
          * reducing the *largest* coefficient by 1; this matches the
          * approach used for the default coefficients in pngrtran.c
          */
         int add = 0;

         if (r+g+b > 32768)
            add = -1;
         else if (r+g+b < 32768)
            add = 1;

         if (add != 0)
         {
            if (g >= r && g >= b)
               g += add;
            else if (r >= g && r >= b)
               r += add;
            else
               b += add;
         }

         /* Check for an internal error. */
         if (r+g+b != 32768)
            png_error(png_ptr,
                "internal error handling cHRM coefficients");

         else
         {
            png_ptr->rgb_to_gray_red_coeff   = (png_uint_16)r;
            png_ptr->rgb_to_gray_green_coeff = (png_uint_16)g;
         }
      }

      /* This is a png_error at present even though it could be ignored -
       * it should never happen, but it is important that if it does, the
       * bug is fixed.
       */
      else
         png_error(png_ptr, "internal error handling cHRM->XYZ");
   }
}